

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiTable::ImGuiTable(ImGuiTable *this)

{
  ImGuiTable *this_local;
  
  ImSpan<ImGuiTableColumn>::ImSpan(&this->Columns);
  ImSpan<signed_char>::ImSpan(&this->DisplayOrderToIndex);
  ImSpan<ImGuiTableCellData>::ImSpan(&this->RowCellData);
  ImRect::ImRect(&this->OuterRect);
  ImRect::ImRect(&this->InnerRect);
  ImRect::ImRect(&this->WorkRect);
  ImRect::ImRect(&this->InnerClipRect);
  ImRect::ImRect(&this->BgClipRect);
  ImRect::ImRect(&this->Bg0ClipRectForDrawCmd);
  ImRect::ImRect(&this->Bg2ClipRectForDrawCmd);
  ImRect::ImRect(&this->HostClipRect);
  ImRect::ImRect(&this->HostBackupInnerClipRect);
  ImGuiTextBuffer::ImGuiTextBuffer(&this->ColumnsNames);
  ImGuiTableInstanceData::ImGuiTableInstanceData(&this->InstanceDataFirst);
  ImVector<ImGuiTableInstanceData>::ImVector(&this->InstanceDataExtra);
  ImGuiTableColumnSortSpecs::ImGuiTableColumnSortSpecs(&this->SortSpecsSingle);
  ImVector<ImGuiTableColumnSortSpecs>::ImVector(&this->SortSpecsMulti);
  ImGuiTableSortSpecs::ImGuiTableSortSpecs(&this->SortSpecs);
  memset(this,0,0x218);
  this->LastFrameActive = -1;
  return;
}

Assistant:

ImGuiTable()                { memset(this, 0, sizeof(*this)); LastFrameActive = -1; }